

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::reset_socket(rpc_client *this)

{
  bool bVar1;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *this_00;
  int __oflag;
  long in_RDI;
  error_code igored_ec;
  io_context *in_stack_ffffffffffffff48;
  error_code *this_01;
  int local_90 [26];
  int local_28;
  error_code local_18;
  
  this_01 = &local_18;
  std::error_code::error_code(this_01);
  local_28 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
                       ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 0x18),
                        (int)this_01);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)this_01,
             in_stack_ffffffffffffff48,0);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::operator=
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)this_01,
             (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff48)
  ;
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)0x1d1d9a);
  bVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open
                    ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)this_01);
  if (!bVar1) {
    this_00 = (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 0x18);
    local_90[0] = (int)asio::ip::tcp::v4();
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::open(this_00,(char *)local_90,__oflag)
    ;
  }
  return;
}

Assistant:

void reset_socket() {
    asio::error_code igored_ec;
    socket_.close(igored_ec);
    socket_ = decltype(socket_)(ios_);
    if (!socket_.is_open()) {
      socket_.open(asio::ip::tcp::v4());
    }
  }